

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

void __thiscall
compiler::CompilerAstWalker::visitWhileStatementAstNode
          (CompilerAstWalker *this,WhileStatementAstNode *node)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  size_type local_20;
  WhileStatementAstNode *local_18;
  WhileStatementAstNode *node_local;
  CompilerAstWalker *this_local;
  
  local_18 = node;
  node_local = (WhileStatementAstNode *)this;
  (*(this->super_AstWalker)._vptr_AstWalker[0x17])(this,node);
  peVar1 = std::__shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(local_18->expression).
                       super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>);
  (*(this->super_AstWalker)._vptr_AstWalker[3])(this,peVar1);
  peVar2 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  peVar3 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  local_20 = std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::size
                       (&peVar3->byteCode);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&peVar2->loopConditionEvalJumpIndices,&local_20);
  emit(this,JumpIfFalse);
  peVar4 = std::__shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(local_18->statement).
                       super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>);
  (*(this->super_AstWalker)._vptr_AstWalker[2])(this,peVar4);
  (*(this->super_AstWalker)._vptr_AstWalker[0x26])(this,local_18);
  return;
}

Assistant:

void visitWhileStatementAstNode(WhileStatementAstNode* node) noexcept override {
    this->onEnterWhileStatementAstNode(node);
    this->visitExpressionAstNode(node->expression.get());
    this->ec->loopConditionEvalJumpIndices.push_back(this->ec->byteCode.size());
    this->emit(bytecode::ByteCodeInstruction::JumpIfFalse);
    this->visitStatementAstNode(node->statement.get());
    this->onExitWhileStatementAstNode(node);
  }